

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O1

void __thiscall
OIDType::OIDType(OIDType *this,string *value,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *data,bool valid)

{
  pointer pcVar1;
  
  (this->super_BER_CONTAINER)._type = OID;
  (this->super_BER_CONTAINER)._length = 0;
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OIDType_001a46e0;
  this->valid = valid;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_value,pcVar1,pcVar1 + value->_M_string_length);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,data);
  return;
}

Assistant:

explicit OIDType(const std::string& value, const std::vector<uint8_t>& data, bool valid): BER_CONTAINER(OID), valid(valid), _value(value), data(data) {}